

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

int sndio_init(cubeb_conflict2 **context,char *context_name)

{
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var1;
  void *pvVar2;
  char *pcVar3;
  sio_hdl *psVar4;
  cubeb_conflict2 *pcVar5;
  
  pvVar2 = (void *)dlopen("libsndio.so.7.0",1);
  if ((pvVar2 == (void *)0x0) && (pvVar2 = (void *)dlopen("libsndio.so",1), pvVar2 == (void *)0x0))
  {
    return -1;
  }
  cubeb_sio_close = (_func_void_sio_hdl_ptr *)dlsym(pvVar2,"sio_close");
  if (((((cubeb_sio_close != (_func_void_sio_hdl_ptr *)0x0) &&
        (cubeb_sio_eof = (_func_int_sio_hdl_ptr *)dlsym(pvVar2,"sio_eof"),
        cubeb_sio_eof != (_func_int_sio_hdl_ptr *)0x0)) &&
       (cubeb_sio_getpar = (_func_int_sio_hdl_ptr_sio_par_ptr *)dlsym(pvVar2,"sio_getpar"),
       cubeb_sio_getpar != (_func_int_sio_hdl_ptr_sio_par_ptr *)0x0)) &&
      ((((cubeb_sio_initpar = (_func_void_sio_par_ptr *)dlsym(pvVar2,"sio_initpar"),
         cubeb_sio_initpar != (_func_void_sio_par_ptr *)0x0 &&
         (cubeb_sio_nfds = (_func_int_sio_hdl_ptr *)dlsym(pvVar2,"sio_nfds"),
         cubeb_sio_nfds != (_func_int_sio_hdl_ptr *)0x0)) &&
        ((cubeb_sio_onmove =
               (_func_void_sio_hdl_ptr__func_void_void_ptr_int_ptr_void_ptr *)
               dlsym(pvVar2,"sio_onmove"),
         cubeb_sio_onmove != (_func_void_sio_hdl_ptr__func_void_void_ptr_int_ptr_void_ptr *)0x0 &&
         ((cubeb_sio_open = (_func_sio_hdl_ptr_char_ptr_uint_int *)dlsym(pvVar2,"sio_open"),
          cubeb_sio_open != (_func_sio_hdl_ptr_char_ptr_uint_int *)0x0 &&
          (cubeb_sio_pollfd = (_func_int_sio_hdl_ptr_pollfd_ptr_int *)dlsym(pvVar2,"sio_pollfd"),
          cubeb_sio_pollfd != (_func_int_sio_hdl_ptr_pollfd_ptr_int *)0x0)))))) &&
       (cubeb_sio_read = (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)dlsym(pvVar2,"sio_read"),
       cubeb_sio_read != (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)0x0)))) &&
     ((((cubeb_sio_revents = (_func_int_sio_hdl_ptr_pollfd_ptr *)dlsym(pvVar2,"sio_revents"),
        cubeb_sio_revents != (_func_int_sio_hdl_ptr_pollfd_ptr *)0x0 &&
        (cubeb_sio_setpar = (_func_int_sio_hdl_ptr_sio_par_ptr *)dlsym(pvVar2,"sio_setpar"),
        cubeb_sio_setpar != (_func_int_sio_hdl_ptr_sio_par_ptr *)0x0)) &&
       (cubeb_sio_start = (_func_int_sio_hdl_ptr *)dlsym(pvVar2,"sio_start"),
       cubeb_sio_start != (_func_int_sio_hdl_ptr *)0x0)) &&
      ((cubeb_sio_stop = (_func_int_sio_hdl_ptr *)dlsym(pvVar2,"sio_stop"),
       cubeb_sio_stop != (_func_int_sio_hdl_ptr *)0x0 &&
       (cubeb_sio_write = (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)dlsym(pvVar2,"sio_write"),
       p_Var1 = cubeb_sio_open, cubeb_sio_write != (_func_size_t_sio_hdl_ptr_void_ptr_size_t *)0x0))
      )))) {
    pcVar3 = sndio_get_device();
    psVar4 = (*p_Var1)(pcVar3,1,1);
    if (psVar4 == (sio_hdl *)0x0) {
      return -1;
    }
    (*cubeb_sio_close)(psVar4);
    pcVar5 = (cubeb_conflict2 *)malloc(0x10);
    *context = pcVar5;
    if (pcVar5 == (cubeb_conflict2 *)0x0) {
      return -1;
    }
    pcVar5->libsndio = pvVar2;
    pcVar5->ops = &sndio_ops;
    return 0;
  }
  dlclose(pvVar2);
  return -1;
}

Assistant:

int
sndio_init(cubeb **context, char const *context_name)
{
  void * libsndio = NULL;
  struct sio_hdl *hdl;

  assert(context);

#ifndef DISABLE_LIBSNDIO_DLOPEN
  libsndio = dlopen("libsndio.so.7.0", RTLD_LAZY);
  if (!libsndio) {
    libsndio = dlopen("libsndio.so", RTLD_LAZY);
    if (!libsndio) {
      DPR("sndio_init(%s) failed dlopen(libsndio.so)\n", context_name);
      return CUBEB_ERROR;
    }
  }

#define LOAD(x) {                               \
    cubeb_##x = dlsym(libsndio, #x);            \
    if (!cubeb_##x) {                           \
      DPR("sndio_init(%s) failed dlsym(%s)\n", context_name, #x); \
      dlclose(libsndio);                        \
      return CUBEB_ERROR;                       \
    }                                           \
  }

  LIBSNDIO_API_VISIT(LOAD);
#undef LOAD
#endif

  /* test if sndio works */
  hdl = WRAP(sio_open)(sndio_get_device(), SIO_PLAY, 1);
  if (hdl == NULL) {
    return CUBEB_ERROR;
  }
  WRAP(sio_close)(hdl);

  DPR("sndio_init(%s)\n", context_name);
  *context = malloc(sizeof(**context));
  if (*context == NULL)
	return CUBEB_ERROR;
  (*context)->libsndio = libsndio;
  (*context)->ops = &sndio_ops;
  (void)context_name;
  return CUBEB_OK;
}